

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

bool __thiscall ON_PolylineCurve::ChangeClosedCurveSeam(ON_PolylineCurve *this,double t)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  ON_3dPoint *pOVar7;
  double dVar8;
  double dVar9;
  int local_144;
  ON_3dPointArray local_f8;
  double local_e0;
  double d;
  int j;
  int n;
  ON_3dPoint new_start;
  undefined1 local_a8 [8];
  ON_SimpleArray<double> new_t;
  ON_SimpleArray<ON_3dPoint> new_pt;
  int new_count;
  double normalized_span_tol;
  double s_1;
  ON_Interval span_domain;
  int i;
  int old_count;
  double s;
  double k;
  undefined1 auStack_30 [7];
  bool rc;
  ON_Interval old_dom;
  double t_local;
  ON_PolylineCurve *this_local;
  
  old_dom.m_t[1] = t;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  uVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])();
  k._7_1_ = (byte)uVar3 & 1;
  if ((uVar3 & 1) == 0) goto LAB_0080a401;
  s = old_dom.m_t[1];
  bVar2 = ON_Interval::Includes((ON_Interval *)auStack_30,old_dom.m_t[1],false);
  if (!bVar2) {
    dVar8 = ON_Interval::NormalizedParameterAt((ON_Interval *)auStack_30,old_dom.m_t[1]);
    _i = fmod(dVar8,1.0);
    if (_i < 0.0) {
      _i = _i + 1.0;
    }
    s = ON_Interval::ParameterAt((ON_Interval *)auStack_30,_i);
  }
  bVar2 = ON_Interval::Includes((ON_Interval *)auStack_30,s,true);
  if (bVar2) {
    iVar4 = PointCount(this);
    span_domain.m_t[1]._4_4_ = iVar4;
    pdVar6 = ON_SimpleArray<double>::Array(&this->m_t);
    span_domain.m_t[1]._0_4_ = ON_NurbsSpanIndex(2,iVar4,pdVar6,s,0,0);
    dVar8 = s;
    pdVar6 = ON_SimpleArray<double>::operator[](&this->m_t,span_domain.m_t[1]._0_4_);
    dVar1 = s;
    if (dVar8 < *pdVar6) {
      return false;
    }
    pdVar6 = ON_SimpleArray<double>::operator[](&this->m_t,span_domain.m_t[1]._0_4_ + 1);
    if (*pdVar6 <= dVar1) {
      return false;
    }
    pdVar6 = ON_SimpleArray<double>::operator[](&this->m_t,span_domain.m_t[1]._0_4_);
    dVar8 = *pdVar6;
    pdVar6 = ON_SimpleArray<double>::operator[](&this->m_t,span_domain.m_t[1]._0_4_ + 1);
    ON_Interval::ON_Interval((ON_Interval *)&s_1,dVar8,*pdVar6);
    dVar8 = ON_Interval::NormalizedParameterAt((ON_Interval *)&s_1,s);
    if (1.7763568394002505e-15 < dVar8) {
      if (0.9999999999999982 <= dVar8) {
        pdVar6 = ON_Interval::operator[]((ON_Interval *)&s_1,1);
        iVar4 = span_domain.m_t[1]._4_4_;
        s = *pdVar6;
        pdVar6 = ON_SimpleArray<double>::Array(&this->m_t);
        span_domain.m_t[1]._0_4_ = ON_NurbsSpanIndex(2,iVar4,pdVar6,s,0,0);
      }
    }
    else {
      pdVar6 = ON_Interval::operator[]((ON_Interval *)&s_1,0);
      s = *pdVar6;
    }
    dVar8 = s;
    dVar9 = ON_Interval::operator[]((ON_Interval *)auStack_30,0);
    dVar1 = s;
    if ((dVar8 != dVar9) || (NAN(dVar8) || NAN(dVar9))) {
      dVar9 = ON_Interval::operator[]((ON_Interval *)auStack_30,1);
      dVar8 = s;
      if ((dVar1 != dVar9) || (NAN(dVar1) || NAN(dVar9))) {
        pdVar6 = ON_SimpleArray<double>::operator[](&this->m_t,span_domain.m_t[1]._0_4_);
        if ((dVar8 != *pdVar6) || (NAN(dVar8) || NAN(*pdVar6))) {
          local_144 = span_domain.m_t[1]._4_4_ + 1;
        }
        else {
          local_144 = span_domain.m_t[1]._4_4_;
        }
        ON_SimpleArray<ON_3dPoint>::ON_SimpleArray
                  ((ON_SimpleArray<ON_3dPoint> *)&new_t.m_count,(long)local_144);
        ON_SimpleArray<double>::ON_SimpleArray((ON_SimpleArray<double> *)local_a8,(long)local_144);
        dVar8 = s;
        pdVar6 = ON_SimpleArray<double>::operator[](&this->m_t,span_domain.m_t[1]._0_4_);
        if ((dVar8 != *pdVar6) || (NAN(dVar8) || NAN(*pdVar6))) {
          ON_Curve::PointAt((ON_3dPoint *)&j,&this->super_ON_Curve,s);
        }
        else {
          pOVar7 = ON_SimpleArray<ON_3dPoint>::operator[]
                             ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,span_domain.m_t[1]._0_4_)
          ;
          _j = pOVar7->x;
          new_start.x = pOVar7->y;
          new_start.y = pOVar7->z;
        }
        ON_SimpleArray<ON_3dPoint>::Append
                  ((ON_SimpleArray<ON_3dPoint> *)&new_t.m_count,(ON_3dPoint *)&j);
        ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_a8,&s);
        iVar4 = ~span_domain.m_t[1]._0_4_ + span_domain.m_t[1]._4_4_;
        d._4_4_ = iVar4;
        pOVar7 = ON_SimpleArray<ON_3dPoint>::Array((ON_SimpleArray<ON_3dPoint> *)&this->m_pline);
        ON_SimpleArray<ON_3dPoint>::Append
                  ((ON_SimpleArray<ON_3dPoint> *)&new_t.m_count,iVar4,
                   pOVar7 + (long)(int)span_domain.m_t[1]._0_4_ + 1);
        iVar4 = d._4_4_;
        pdVar6 = ON_SimpleArray<double>::Array(&this->m_t);
        ON_SimpleArray<double>::Append
                  ((ON_SimpleArray<double> *)local_a8,iVar4,
                   pdVar6 + (long)(int)span_domain.m_t[1]._0_4_ + 1);
        d._0_4_ = ON_SimpleArray<double>::Count((ON_SimpleArray<double> *)local_a8);
        iVar4 = (local_144 - span_domain.m_t[1]._4_4_) + -1 + span_domain.m_t[1]._0_4_;
        d._4_4_ = iVar4;
        pOVar7 = ON_SimpleArray<ON_3dPoint>::Array((ON_SimpleArray<ON_3dPoint> *)&this->m_pline);
        ON_SimpleArray<ON_3dPoint>::Append
                  ((ON_SimpleArray<ON_3dPoint> *)&new_t.m_count,iVar4,pOVar7 + 1);
        iVar4 = d._4_4_;
        pdVar6 = ON_SimpleArray<double>::Array(&this->m_t);
        ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_a8,iVar4,pdVar6 + 1);
        ON_SimpleArray<ON_3dPoint>::Append
                  ((ON_SimpleArray<ON_3dPoint> *)&new_t.m_count,(ON_3dPoint *)&j);
        ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_a8,&s);
        local_e0 = ON_Interval::Length((ON_Interval *)auStack_30);
        for (; iVar4 = d._0_4_,
            iVar5 = ON_SimpleArray<double>::Count((ON_SimpleArray<double> *)local_a8),
            dVar8 = local_e0, iVar4 < iVar5; d._0_4_ = d._0_4_ + 1) {
          pdVar6 = ON_SimpleArray<double>::operator[]((ON_SimpleArray<double> *)local_a8,d._0_4_);
          *pdVar6 = dVar8 + *pdVar6;
        }
        ON_3dPointArray::ON_3dPointArray(&local_f8,(ON_SimpleArray<ON_3dPoint> *)&new_t.m_count);
        ON_Polyline::operator=(&this->m_pline,&local_f8);
        ON_3dPointArray::~ON_3dPointArray(&local_f8);
        ON_SimpleArray<double>::operator=(&this->m_t,(ON_SimpleArray<double> *)local_a8);
        ON_SimpleArray<double>::~ON_SimpleArray((ON_SimpleArray<double> *)local_a8);
        ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray((ON_SimpleArray<ON_3dPoint> *)&new_t.m_count);
        goto LAB_0080a382;
      }
    }
    k._7_1_ = 1;
  }
  else {
    k._7_1_ = 1;
  }
LAB_0080a382:
  dVar8 = old_dom.m_t[1];
  if ((k._7_1_ & 1) != 0) {
    dVar9 = ON_Interval::operator[]((ON_Interval *)auStack_30,0);
    dVar1 = old_dom.m_t[1];
    if ((dVar8 != dVar9) || (NAN(dVar8) || NAN(dVar9))) {
      dVar8 = ON_Interval::Length((ON_Interval *)auStack_30);
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                (dVar1,dVar1 + dVar8);
    }
  }
LAB_0080a401:
  return (bool)(k._7_1_ & 1);
}

Assistant:

bool ON_PolylineCurve::ChangeClosedCurveSeam( double t )
{
  const ON_Interval old_dom = Domain();
  bool rc = IsClosed();
  if ( rc )
  {
    double k = t;

    if ( !old_dom.Includes(t) )
    {
      // If you know why this is here, please add
      // a bug reference so we can retest when this code
      // is cleaned up.  It needs to be cleaned up.
      double s = old_dom.NormalizedParameterAt(t);
      s = fmod(s,1.0);
      if ( s < 0.0 )
        s += 1.0;
      k = old_dom.ParameterAt(s);
    }



    if ( old_dom.Includes(k,true) )
    {
      int old_count = PointCount();
      int i = ON_NurbsSpanIndex(2,old_count,m_t.Array(),k,0,0);
      if ( k < m_t[i] )
        return false;
      if ( k >= m_t[i+1] )
        return false;

      // 20 Feb 2014 Dale L & Lowell - This was making a new point in the polyline
      // when the seam was changed to a t within eps of an existing point.
      // This change snaps the t to existing points if it is within normalized_span_tol
      // of one that already exists. ON_EPSILON didn't quite work but 8 * ON_EPSILON does
      // comparing t = 4149.8519999999990 to m_t[1] = 4149.8519999999980 in RH-24591
      ON_Interval span_domain(m_t[i],m_t[i+1]);
      double s = span_domain.NormalizedParameterAt(k);
      double normalized_span_tol = 8.0*ON_EPSILON;
      if ( s <= normalized_span_tol )
      {
        k = span_domain[0];
      }
      else if ( s >= 1.0 - normalized_span_tol )
      {
        k = span_domain[1];
        i = ON_NurbsSpanIndex(2,old_count,m_t.Array(),k,0,0);
      }

      if ( k == old_dom[0] || k == old_dom[1] )
      {
        // k already at start end of this curve
        rc = true;
      }
      else
      {
        int new_count = (k==m_t[i]) ? old_count : old_count+1;
        ON_SimpleArray<ON_3dPoint> new_pt(new_count);
        ON_SimpleArray<double> new_t(new_count);
        ON_3dPoint new_start = (k==m_t[i]) ? m_pline[i] : PointAt(k);
        new_pt.Append( new_start );
        new_t.Append(k);
        int n = old_count-i-1;
        new_pt.Append( n, m_pline.Array() + i+1 );
        new_t.Append( n, m_t.Array() + i+1 );
      
        int j = new_t.Count();

        n = new_count-old_count+i-1;
        new_pt.Append( n, m_pline.Array() + 1 );
        new_t.Append(  n, m_t.Array() + 1 );

        new_pt.Append( new_start );
        new_t.Append(k);

        double d = old_dom.Length();
        while ( j  < new_t.Count() )
        {
          new_t[j] += d;
          j++;
        }

        m_pline = new_pt;
        m_t = new_t;
      }
    }
    else
    {
      // k already at start end of this curve
      rc = true;
    }

    if ( rc  && t != old_dom[0] )
      SetDomain( t, t + old_dom.Length() );
  }
  return rc;
}